

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O0

string * __thiscall pbrt::RGBColorSpace::ToString_abi_cxx11_(RGBColorSpace *this)

{
  string *in_RDI;
  Point2<float> *unaff_retaddr;
  Point2<float> *in_stack_00000008;
  Point2<float> *in_stack_00000010;
  Point2<float> *in_stack_00000018;
  char *in_stack_00000020;
  DenselySampledSpectrum *in_stack_00000040;
  SquareMatrix<3> *in_stack_00000048;
  SquareMatrix<3> *in_stack_00000050;
  
  StringPrintf<pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::SquareMatrix<3>const&,pbrt::SquareMatrix<3>const&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             in_stack_00000040,in_stack_00000048,in_stack_00000050);
  return in_RDI;
}

Assistant:

std::string RGBColorSpace::ToString() const {
    return StringPrintf("[ RGBColorSpace r: %s g: %s b: %s w: %s illuminant: "
                        "%s RGBToXYZ: %s XYZToRGB: %s ]",
                        r, g, b, w, illuminant, XYZFromRGB, RGBFromXYZ);
}